

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O3

int Scl_CommandWriteConstr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Scl_Con_t *p;
  bool bVar1;
  int iVar2;
  char *__s1;
  char *pcVar3;
  
  p = (Scl_Con_t *)pAbc->pAbcCon;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 != -1) {
    fwrite("usage: write_constr [-vh] <file>\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\t         writes current timing constraints into a file\n",0x38,1,(FILE *)pAbc->Err);
    pcVar3 = "yes";
    if (!bVar1) {
      pcVar3 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",
            pcVar3);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("\t<file> : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
    return 1;
  }
  if (p == (Scl_Con_t *)0x0) {
    Abc_Print(1,"Scl_CommandWriteConstr(): There is no constraint manager.\n");
    return 0;
  }
  if (globalUtilOptind + 1 == argc) {
    pcVar3 = argv[globalUtilOptind];
  }
  else {
    if (globalUtilOptind != argc) {
      pcVar3 = "Output file name should be given on the command line.";
      goto LAB_00452c27;
    }
    pcVar3 = Extra_FileNameGenericAppend(p->pFileName,"_out.constr");
  }
  __s1 = Extra_FileNameExtension(pcVar3);
  iVar2 = strcmp(__s1,"constr");
  if (iVar2 == 0) {
    Scl_ConWrite(p,pcVar3);
    return 0;
  }
  pcVar3 = "Scl_CommandWriteConstr(): Unrecognized output file extension.";
LAB_00452c27:
  puts(pcVar3);
  return 0;
}

Assistant:

int Scl_CommandWriteConstr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Scl_Con_t * pCon = Scl_ConGetMan( pAbc );
    char * pFileName = NULL;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pCon == NULL )
    {
        Abc_Print( 1, "Scl_CommandWriteConstr(): There is no constraint manager.\n" );
        return 0;
    }
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else if ( argc == globalUtilOptind && pCon )
        pFileName = Extra_FileNameGenericAppend( pCon->pFileName, "_out.constr" );
    else 
    {
        printf( "Output file name should be given on the command line.\n" );
        return 0;
    }
    // perform writing
    if ( !strcmp( Extra_FileNameExtension(pFileName), "constr" )  )
        Scl_ConWrite( pCon, pFileName );
    else 
    {
        printf( "Scl_CommandWriteConstr(): Unrecognized output file extension.\n" );
        return 0;
    }
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_constr [-vh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes current timing constraints into a file\n" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\t<file> : the name of a file to read\n" );
    return 1;
}